

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86.cpp
# Opt level: O2

int __thiscall ncnn::PReLU_x86::forward_inplace(PReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  void *pvVar3;
  float *pfVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar22;
  float fVar23;
  undefined1 auVar21 [16];
  float fVar24;
  
  iVar10 = bottom_top_blob->elempack;
  iVar9 = bottom_top_blob->dims;
  iVar17 = bottom_top_blob->w;
  uVar8 = bottom_top_blob->h;
  if (iVar9 == 3) {
    iVar9 = iVar17 * iVar10 * uVar8;
    uVar13 = 0;
    uVar8 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = 0;
    }
    for (; uVar13 != uVar8; uVar13 = uVar13 + 1) {
      pfVar4 = (float *)(this->super_PReLU).slope_data.data;
      if ((this->super_PReLU).num_slope < 2) {
        fVar19 = *pfVar4;
        fVar20 = fVar19;
        fVar22 = fVar19;
        fVar23 = fVar19;
        fVar24 = fVar19;
      }
      else {
        fVar19 = pfVar4[uVar13];
        fVar20 = fVar19;
        fVar22 = fVar19;
        fVar23 = fVar19;
        fVar24 = fVar19;
        if (iVar10 == 4) {
          pfVar4 = pfVar4 + uVar13 * 4;
          fVar20 = *pfVar4;
          fVar22 = pfVar4[1];
          fVar23 = pfVar4[2];
          fVar24 = pfVar4[3];
        }
      }
      pvVar3 = bottom_top_blob->data;
      sVar5 = bottom_top_blob->elemsize;
      sVar6 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [16])(sVar6 * uVar13 * sVar5 + (long)pvVar3);
      lVar11 = 0;
      for (iVar17 = 0; iVar17 + 3 < iVar9; iVar17 = iVar17 + 4) {
        auVar21 = maxps(*pauVar15,ZEXT816(0));
        auVar18 = minps(*pauVar15,ZEXT816(0));
        *(float *)*pauVar15 = auVar18._0_4_ * fVar20 + auVar21._0_4_;
        *(float *)(*pauVar15 + 4) = auVar18._4_4_ * fVar22 + auVar21._4_4_;
        *(float *)(*pauVar15 + 8) = auVar18._8_4_ * fVar23 + auVar21._8_4_;
        *(float *)(*pauVar15 + 0xc) = auVar18._12_4_ * fVar24 + auVar21._12_4_;
        pauVar15 = pauVar15 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar14 = sVar6 * sVar5 * uVar13;
      for (; (int)lVar11 < iVar9; lVar11 = lVar11 + 1) {
        fVar20 = *(float *)((long)pvVar3 + lVar11 * 4 + lVar14);
        if (fVar20 < 0.0) {
          *(float *)((long)pvVar3 + lVar11 * 4 + lVar14) = fVar20 * fVar19;
        }
      }
    }
  }
  else if (iVar9 == 2) {
    uVar12 = 0;
    uVar13 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar13 = uVar12;
    }
    for (; uVar12 != uVar13; uVar12 = uVar12 + 1) {
      pfVar4 = (float *)(this->super_PReLU).slope_data.data;
      if ((this->super_PReLU).num_slope < 2) {
        fVar19 = *pfVar4;
        fVar20 = fVar19;
        fVar22 = fVar19;
        fVar23 = fVar19;
        fVar24 = fVar19;
      }
      else {
        fVar19 = pfVar4[uVar12];
        fVar20 = fVar19;
        fVar22 = fVar19;
        fVar23 = fVar19;
        fVar24 = fVar19;
        if (iVar10 == 4) {
          pfVar4 = pfVar4 + uVar12 * 4;
          fVar20 = *pfVar4;
          fVar22 = pfVar4[1];
          fVar23 = pfVar4[2];
          fVar24 = pfVar4[3];
        }
      }
      pvVar3 = bottom_top_blob->data;
      sVar5 = bottom_top_blob->elemsize;
      iVar9 = bottom_top_blob->w;
      pauVar15 = (undefined1 (*) [16])(uVar12 * (long)iVar9 * sVar5 + (long)pvVar3);
      lVar11 = 0;
      for (iVar16 = 0; iVar16 + 3 < iVar17 * iVar10; iVar16 = iVar16 + 4) {
        auVar21 = maxps(*pauVar15,ZEXT816(0));
        auVar18 = minps(*pauVar15,ZEXT816(0));
        *(float *)*pauVar15 = auVar18._0_4_ * fVar20 + auVar21._0_4_;
        *(float *)(*pauVar15 + 4) = auVar18._4_4_ * fVar22 + auVar21._4_4_;
        *(float *)(*pauVar15 + 8) = auVar18._8_4_ * fVar23 + auVar21._8_4_;
        *(float *)(*pauVar15 + 0xc) = auVar18._12_4_ * fVar24 + auVar21._12_4_;
        pauVar15 = pauVar15 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar14 = sVar5 * uVar12 * (long)iVar9;
      for (; (int)lVar11 < iVar17 * iVar10; lVar11 = lVar11 + 1) {
        fVar20 = *(float *)((long)pvVar3 + lVar11 * 4 + lVar14);
        if (fVar20 < 0.0) {
          *(float *)((long)pvVar3 + lVar11 * 4 + lVar14) = fVar20 * fVar19;
        }
      }
    }
  }
  else if (iVar9 == 1) {
    iVar10 = iVar10 * iVar17;
    pvVar3 = bottom_top_blob->data;
    pfVar4 = (float *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      fVar19 = *pfVar4;
      uVar8 = iVar10 / 4;
      lVar11 = 0;
      uVar13 = 0;
      if (0 < (int)uVar8) {
        uVar13 = (ulong)uVar8;
      }
      for (; uVar13 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
        auVar21 = maxps(*(undefined1 (*) [16])((long)pvVar3 + lVar11),ZEXT816(0));
        auVar18 = minps(*(undefined1 (*) [16])((long)pvVar3 + lVar11),ZEXT816(0));
        pfVar4 = (float *)((long)pvVar3 + lVar11);
        *pfVar4 = auVar18._0_4_ * fVar19 + auVar21._0_4_;
        pfVar4[1] = auVar18._4_4_ * fVar19 + auVar21._4_4_;
        pfVar4[2] = auVar18._8_4_ * fVar19 + auVar21._8_4_;
        pfVar4[3] = auVar18._12_4_ * fVar19 + auVar21._12_4_;
      }
      for (lVar11 = (long)(int)(uVar8 << 2); lVar11 < iVar10; lVar11 = lVar11 + 1) {
        fVar20 = *(float *)((long)pvVar3 + lVar11 * 4);
        if (fVar20 < 0.0) {
          *(float *)((long)pvVar3 + lVar11 * 4) = fVar20 * fVar19;
        }
      }
    }
    else {
      uVar8 = iVar10 / 4;
      lVar11 = 0;
      uVar13 = 0;
      if (0 < (int)uVar8) {
        uVar13 = (ulong)uVar8;
      }
      for (; uVar13 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
        pfVar1 = (float *)((long)pfVar4 + lVar11);
        fVar19 = pfVar1[1];
        fVar20 = pfVar1[2];
        fVar22 = pfVar1[3];
        auVar21 = maxps(*(undefined1 (*) [16])((long)pvVar3 + lVar11),ZEXT816(0));
        auVar18 = minps(*(undefined1 (*) [16])((long)pvVar3 + lVar11),ZEXT816(0));
        pfVar2 = (float *)((long)pvVar3 + lVar11);
        *pfVar2 = auVar18._0_4_ * *pfVar1 + auVar21._0_4_;
        pfVar2[1] = auVar18._4_4_ * fVar19 + auVar21._4_4_;
        pfVar2[2] = auVar18._8_4_ * fVar20 + auVar21._8_4_;
        pfVar2[3] = auVar18._12_4_ * fVar22 + auVar21._12_4_;
      }
      pvVar7 = (this->super_PReLU).slope_data.data;
      for (lVar11 = (long)(int)(uVar8 << 2); lVar11 < iVar10; lVar11 = lVar11 + 1) {
        fVar19 = *(float *)((long)pvVar3 + lVar11 * 4);
        if (fVar19 < 0.0) {
          *(float *)((long)pvVar3 + lVar11 * 4) = fVar19 * *(float *)((long)pvVar7 + lVar11 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}